

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void SparseKeygenRecurse<Blob<288>,unsigned_int>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<288> *k,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  undefined1 in_CL;
  int in_EDX;
  uint32_t in_ESI;
  code *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_R8;
  Blob<288> *in_R9;
  int i;
  uint h;
  int nbits;
  int nbytes;
  uint32_t local_38;
  undefined1 local_34 [4];
  undefined4 uVar1;
  undefined4 uVar2;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint start_00;
  
  start_00 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  uVar2 = 0x24;
  uVar1 = 0x120;
  for (local_38 = in_ESI; (int)local_38 < 0x120; local_38 = local_38 + 1) {
    flipbit(in_R8,0x24,local_38);
    if (((start_00 & 0x1000000) != 0) || (in_EDX == 1)) {
      (*in_RDI)(in_R8,0x24,0,local_34);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_R8,(value_type_conflict1 *)in_R9);
    }
    if (1 < in_EDX) {
      SparseKeygenRecurse<Blob<288>,unsigned_int>
                ((pfHash)CONCAT44(in_ESI,in_EDX),start_00,in_stack_ffffffffffffffe8,
                 SUB81((ulong)in_R8 >> 0x38,0),in_R9,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar2,uVar1));
    }
    flipbit(in_R8,0x24,local_38);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}